

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

size_t bitset_extract_setbits_uint16(uint64_t *words,size_t length,uint16_t *out,uint16_t base)

{
  int iVar1;
  short in_CX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  ulong in_RSI;
  long in_RDI;
  int r;
  uint64_t t;
  uint64_t w;
  size_t i;
  int outpos;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined2 local_1a;
  
  local_20 = 0;
  local_1a = in_CX;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    for (local_30 = *(ulong *)(in_RDI + local_28 * 8); local_30 != 0;
        local_30 = local_30 & (local_30 ^ 0xffffffffffffffff) + 1 ^ local_30) {
      iVar1 = roaring_trailing_zeroes(local_30);
      *(short *)(CONCAT62(in_register_00000012,in_DX) + (long)local_20 * 2) =
           (short)iVar1 + local_1a;
      local_20 = local_20 + 1;
    }
    local_1a = local_1a + 0x40;
  }
  return (long)local_20;
}

Assistant:

size_t bitset_extract_setbits_uint16(const uint64_t *words, size_t length,
                                     uint16_t *out, uint16_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            out[outpos++] = (uint16_t)(r + base);
            w ^= t;
        }
        base += 64;
    }
    return outpos;
}